

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Allocation * __thiscall
google::protobuf::DescriptorPool::Tables::
CreateFlatAlloc<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
          (Tables *this,
          TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          *sizes)

{
  pointer *ppuVar1;
  int iVar2;
  int iVar3;
  unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
  *puVar4;
  unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
  *puVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Base<char> BVar9;
  FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *pFVar10;
  undefined1 *puVar11;
  undefined8 *puVar12;
  _Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
  *this_00;
  pointer puVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
  *this_01;
  int iVar26;
  size_t __n;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
  *this_02;
  int iVar33;
  unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
  *__cur;
  pointer puVar34;
  int iVar35;
  int iVar36;
  SourceCodeInfo *this_03;
  FeatureSet *this_04;
  MessageOptions *this_05;
  FieldOptions *this_06;
  EnumOptions *this_07;
  EnumValueOptions *this_08;
  ExtensionRangeOptions *this_09;
  OneofOptions *this_10;
  ServiceOptions *this_11;
  MethodOptions *this_12;
  FileOptions *this_13;
  
  iVar2 = (sizes->payload_).super_Base<char>.value;
  iVar6 = (sizes->payload_).
          super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .value * 0x20;
  iVar3 = (sizes->payload_).super_Base<google::protobuf::SourceCodeInfo>.value;
  iVar27 = (sizes->payload_).super_Base<google::protobuf::FileDescriptorTables>.value * 200;
  iVar29 = (sizes->payload_).super_Base<google::protobuf::MessageOptions>.value * 0x58;
  iVar30 = (sizes->payload_).super_Base<google::protobuf::FieldOptions>.value * 0x98;
  iVar17 = (sizes->payload_).super_Base<google::protobuf::FeatureSet>.value * 0x50;
  iVar31 = (sizes->payload_).super_Base<google::protobuf::EnumOptions>.value * 0x58;
  iVar25 = (sizes->payload_).super_Base<google::protobuf::EnumValueOptions>.value * 0x60;
  iVar35 = (sizes->payload_).super_Base<google::protobuf::ExtensionRangeOptions>.value * 0x70;
  iVar7 = (sizes->payload_).super_Base<google::protobuf::ServiceOptions>.value * 0x58;
  iVar14 = (sizes->payload_).super_Base<google::protobuf::MethodOptions>.value * 0x58;
  iVar26 = (sizes->payload_).super_Base<google::protobuf::FileOptions>.value * 0xb0;
  iVar32 = (sizes->payload_).super_Base<google::protobuf::OneofOptions>.value * 0x50;
  iVar33 = iVar6 + iVar2 + iVar3 * 0x48;
  iVar36 = iVar27 + iVar33;
  iVar28 = iVar17 + iVar36;
  iVar18 = iVar29 + iVar28;
  iVar19 = iVar30 + iVar18;
  iVar20 = iVar31 + iVar19;
  iVar21 = iVar25 + iVar20;
  iVar22 = iVar35 + iVar21;
  iVar23 = iVar22 + iVar32;
  iVar24 = iVar23 + iVar7;
  iVar8 = iVar14 + iVar24;
  pFVar10 = (FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             *)operator_new((long)(iVar8 + iVar26) + 0x38);
  BVar9.value = iVar2 + 0x38;
  (pFVar10->ends_).payload_.super_Base<char>.value = BVar9.value;
  iVar15 = iVar6 + 0x38 + iVar2;
  (pFVar10->ends_).payload_.
  super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.value
       = iVar15;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::SourceCodeInfo>.value =
       iVar6 + iVar2 + iVar3 * 0x48 + 0x38;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::FileDescriptorTables>.value =
       iVar27 + 0x38 + iVar33;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::FeatureSet>.value = iVar17 + 0x38 + iVar36;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::MessageOptions>.value =
       iVar29 + 0x38 + iVar28;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::FieldOptions>.value =
       iVar30 + 0x38 + iVar18;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::EnumOptions>.value = iVar31 + 0x38 + iVar19
  ;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::EnumValueOptions>.value =
       iVar25 + 0x38 + iVar20;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value =
       iVar35 + 0x38 + iVar21;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::OneofOptions>.value =
       iVar32 + 0x38 + iVar22;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::ServiceOptions>.value =
       iVar7 + 0x38 + iVar23;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::MethodOptions>.value =
       iVar14 + 0x38 + iVar24;
  (pFVar10->ends_).payload_.super_Base<google::protobuf::FileOptions>.value = iVar8 + iVar26 + 0x38;
  if (iVar6 != 0) {
    lVar16 = (long)iVar15 - (long)BVar9.value;
    puVar11 = (undefined1 *)
              ((long)&(pFVar10->ends_).payload_.super_Base<google::protobuf::FeatureSet>.value +
              (long)BVar9.value);
    do {
      *(undefined1 **)(puVar11 + -0x10) = puVar11;
      *(undefined8 *)(puVar11 + -8) = 0;
      *puVar11 = 0;
      puVar11 = puVar11 + 0x20;
      lVar16 = lVar16 + -0x20;
    } while (lVar16 != 0);
  }
  iVar2 = (pFVar10->ends_).payload_.
          super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .value;
  iVar3 = (pFVar10->ends_).payload_.super_Base<google::protobuf::SourceCodeInfo>.value;
  if (iVar2 != iVar3) {
    this_03 = (SourceCodeInfo *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)iVar2);
    lVar16 = (long)iVar3 - (long)iVar2;
    do {
      SourceCodeInfo::SourceCodeInfo(this_03,(Arena *)0x0);
      this_03 = this_03 + 1;
      lVar16 = lVar16 + -0x48;
    } while (lVar16 != 0);
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::SourceCodeInfo>.value;
  iVar3 = (pFVar10->ends_).payload_.super_Base<google::protobuf::FileDescriptorTables>.value;
  if (iVar2 != iVar3) {
    puVar12 = (undefined8 *)((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)iVar2);
    do {
      *puVar12 = 1;
      puVar12[1] = 0;
      puVar12[4] = 0;
      puVar12[5] = 0;
      puVar12[6] = 0;
      puVar12[7] = 1;
      puVar12[8] = 0;
      puVar12[0xb] = 1;
      puVar12[0xc] = 0;
      puVar12[0xf] = 1;
      puVar12[0x10] = 0;
      *(undefined4 *)(puVar12 + 0x13) = 0;
      puVar12[0x14] = 0;
      puVar12[0x15] = 0;
      puVar12[0x16] = 0x1476ff0;
      puVar12[0x18] = 0;
      puVar12 = puVar12 + 0x19;
    } while (puVar12 !=
             (undefined8 *)((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)iVar3));
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::FileDescriptorTables>.value;
  iVar3 = (pFVar10->ends_).payload_.super_Base<google::protobuf::FeatureSet>.value;
  if (iVar2 != iVar3) {
    this_04 = (FeatureSet *)((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)iVar2);
    lVar16 = (long)iVar3 - (long)iVar2;
    do {
      FeatureSet::FeatureSet(this_04,(Arena *)0x0);
      this_04 = this_04 + 1;
      lVar16 = lVar16 + -0x50;
    } while (lVar16 != 0);
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::FeatureSet>.value;
  iVar3 = (pFVar10->ends_).payload_.super_Base<google::protobuf::MessageOptions>.value;
  if (iVar2 != iVar3) {
    this_05 = (MessageOptions *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)iVar2);
    lVar16 = (long)iVar3 - (long)iVar2;
    do {
      MessageOptions::MessageOptions(this_05,(Arena *)0x0);
      this_05 = this_05 + 1;
      lVar16 = lVar16 + -0x58;
    } while (lVar16 != 0);
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::MessageOptions>.value;
  iVar3 = (pFVar10->ends_).payload_.super_Base<google::protobuf::FieldOptions>.value;
  if (iVar2 != iVar3) {
    this_06 = (FieldOptions *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)iVar2);
    lVar16 = (long)iVar3 - (long)iVar2;
    do {
      FieldOptions::FieldOptions(this_06,(Arena *)0x0);
      this_06 = this_06 + 1;
      lVar16 = lVar16 + -0x98;
    } while (lVar16 != 0);
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::FieldOptions>.value;
  iVar3 = (pFVar10->ends_).payload_.super_Base<google::protobuf::EnumOptions>.value;
  if (iVar2 != iVar3) {
    this_07 = (EnumOptions *)((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)iVar2)
    ;
    lVar16 = (long)iVar3 - (long)iVar2;
    do {
      EnumOptions::EnumOptions(this_07,(Arena *)0x0);
      this_07 = this_07 + 1;
      lVar16 = lVar16 + -0x58;
    } while (lVar16 != 0);
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::EnumOptions>.value;
  iVar3 = (pFVar10->ends_).payload_.super_Base<google::protobuf::EnumValueOptions>.value;
  if (iVar2 != iVar3) {
    this_08 = (EnumValueOptions *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)iVar2);
    lVar16 = (long)iVar3 - (long)iVar2;
    do {
      EnumValueOptions::EnumValueOptions(this_08,(Arena *)0x0);
      this_08 = this_08 + 1;
      lVar16 = lVar16 + -0x60;
    } while (lVar16 != 0);
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::EnumValueOptions>.value;
  iVar3 = (pFVar10->ends_).payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value;
  if (iVar2 != iVar3) {
    this_09 = (ExtensionRangeOptions *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)iVar2);
    lVar16 = (long)iVar3 - (long)iVar2;
    do {
      ExtensionRangeOptions::ExtensionRangeOptions(this_09,(Arena *)0x0);
      this_09 = this_09 + 1;
      lVar16 = lVar16 + -0x70;
    } while (lVar16 != 0);
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::ExtensionRangeOptions>.value;
  iVar3 = (pFVar10->ends_).payload_.super_Base<google::protobuf::OneofOptions>.value;
  if (iVar2 != iVar3) {
    this_10 = (OneofOptions *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)iVar2);
    lVar16 = (long)iVar3 - (long)iVar2;
    do {
      OneofOptions::OneofOptions(this_10,(Arena *)0x0);
      this_10 = this_10 + 1;
      lVar16 = lVar16 + -0x50;
    } while (lVar16 != 0);
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::OneofOptions>.value;
  iVar3 = (pFVar10->ends_).payload_.super_Base<google::protobuf::ServiceOptions>.value;
  if (iVar2 != iVar3) {
    this_11 = (ServiceOptions *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)iVar2);
    lVar16 = (long)iVar3 - (long)iVar2;
    do {
      ServiceOptions::ServiceOptions(this_11,(Arena *)0x0);
      this_11 = this_11 + 1;
      lVar16 = lVar16 + -0x58;
    } while (lVar16 != 0);
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::ServiceOptions>.value;
  iVar3 = (pFVar10->ends_).payload_.super_Base<google::protobuf::MethodOptions>.value;
  if (iVar2 != iVar3) {
    this_12 = (MethodOptions *)
              ((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)iVar2);
    lVar16 = (long)iVar3 - (long)iVar2;
    do {
      MethodOptions::MethodOptions(this_12,(Arena *)0x0);
      this_12 = this_12 + 1;
      lVar16 = lVar16 + -0x58;
    } while (lVar16 != 0);
  }
  iVar2 = (pFVar10->ends_).payload_.super_Base<google::protobuf::MethodOptions>.value;
  iVar3 = (pFVar10->ends_).payload_.super_Base<google::protobuf::FileOptions>.value;
  if (iVar2 != iVar3) {
    this_13 = (FileOptions *)((long)&(pFVar10->ends_).payload_.super_Base<char>.value + (long)iVar2)
    ;
    lVar16 = (long)iVar3 - (long)iVar2;
    do {
      FileOptions::FileOptions(this_13,(Arena *)0x0);
      this_13 = this_13 + 1;
      lVar16 = lVar16 + -0xb0;
    } while (lVar16 != 0);
  }
  this_02 = (this->flat_allocs_).
            super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (this_02 ==
      (this->flat_allocs_).
      super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __n = 1;
    this_00 = (_Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
               *)std::
                 vector<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
                 ::_M_check_len(&this->flat_allocs_,1,"vector::_M_realloc_insert");
    puVar4 = (this->flat_allocs_).
             super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (this->flat_allocs_).
             super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar13 = std::
              _Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
              ::_M_allocate(this_00,__n);
    *(FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      **)((long)puVar13 + ((long)this_02 - (long)puVar4)) = pFVar10;
    this_01 = puVar4;
    puVar34 = puVar13;
    if ((long)this_02 - (long)puVar4 != 0) {
      do {
        (puVar34->_M_t).
        super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
        .
        super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_false>
        ._M_head_impl =
             (this_01->_M_t).
             super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
             .
             super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_false>
             ._M_head_impl;
        (this_01->_M_t).
        super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
        .
        super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_false>
        ._M_head_impl =
             (FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              *)0x0;
        std::
        unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
        ::~unique_ptr(this_01);
        this_01 = this_01 + 1;
        puVar34 = puVar34 + 1;
      } while (this_01 != this_02);
    }
    for (; puVar34 = puVar34 + 1, puVar5 != this_02; this_02 = this_02 + 1) {
      (puVar34->_M_t).
      super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
      .
      super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_false>
      ._M_head_impl =
           (this_02->_M_t).
           super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
           .
           super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_false>
           ._M_head_impl;
      (this_02->_M_t).
      super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
      .
      super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_false>
      ._M_head_impl =
           (FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            *)0x0;
      std::
      unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
      ::~unique_ptr(this_02);
    }
    if (puVar4 != (unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
                   *)0x0) {
      operator_delete(puVar4,(long)(this->flat_allocs_).
                                   super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar4
                     );
    }
    (this->flat_allocs_).
    super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar13;
    (this->flat_allocs_).
    super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar34;
    (this->flat_allocs_).
    super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar13 + (long)this_00;
  }
  else {
    (this_02->_M_t).
    super___uniq_ptr_impl<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>
    .
    super__Head_base<0UL,_google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>_*,_false>
    ._M_head_impl = pFVar10;
    ppuVar1 = &(this->flat_allocs_).
               super__Vector_base<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>,_std::allocator<std::unique_ptr<google::protobuf::(anonymous_namespace)::FlatAllocation<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>,_google::protobuf::DescriptorPool::Tables::FlatAllocDeleter>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return pFVar10;
}

Assistant:

internal::FlatAllocator::Allocation* DescriptorPool::Tables::CreateFlatAlloc(
    const TypeMap<IntT, T...>& sizes) {
  auto ends = CalculateEnds(sizes);
  using FlatAlloc = internal::FlatAllocator::Allocation;

  int last_end = ends.template Get<
      typename std::tuple_element<sizeof...(T) - 1, std::tuple<T...>>::type>();
  size_t total_size =
      last_end + RoundUpTo<FlatAlloc::kMaxAlign>(sizeof(FlatAlloc));
  char* data = static_cast<char*>(::operator new(total_size));
  auto* res = ::new (data) FlatAlloc(ends);
  flat_allocs_.emplace_back(res);

  return res;
}